

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::Matcher<mp::LogicalConstant>::Matcher
          (Matcher<mp::LogicalConstant> *this,LogicalConstant value)

{
  linked_ptr<const_testing::MatcherInterface<mp::LogicalConstant>_> local_30;
  
  (this->super_MatcherBase<mp::LogicalConstant>).impl_.value_ =
       (MatcherInterface<mp::LogicalConstant> *)0x0;
  (this->super_MatcherBase<mp::LogicalConstant>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::LogicalConstant>).impl_.link_;
  (this->super_MatcherBase<mp::LogicalConstant>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e1f48;
  local_30.value_ = (MatcherInterface<mp::LogicalConstant> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001e5638;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<mp::LogicalConstant>_>::operator=
            (&(this->super_MatcherBase<mp::LogicalConstant>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<mp::LogicalConstant>_>::~linked_ptr
            (&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }